

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlChar * xmlResolveResourceFromCatalog(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlCatalogAllow xVar2;
  int iVar3;
  xmlChar *URI;
  xmlChar *pxVar4;
  bool bVar5;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->html != 0)) {
    return (xmlChar *)0x0;
  }
  xVar2 = xmlCatalogGetDefaults();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    bVar5 = true;
    bVar1 = 1;
    if ((xVar2 & ~XML_CATA_ALLOW_DOCUMENT) == XML_CATA_ALLOW_GLOBAL) goto LAB_00140b9a;
  }
  else {
    bVar5 = (xVar2 & ~XML_CATA_ALLOW_GLOBAL) != XML_CATA_ALLOW_DOCUMENT ||
            ctxt->catalogs == (void *)0x0;
    bVar1 = 1;
    if ((xVar2 & ~XML_CATA_ALLOW_DOCUMENT) == XML_CATA_ALLOW_GLOBAL &&
        (ctxt->options & 0x2000000U) == 0) goto LAB_00140b9a;
  }
  bVar1 = 0;
  if (xVar2 == XML_CATA_ALLOW_NONE) {
    return (xmlChar *)0x0;
  }
LAB_00140b9a:
  iVar3 = xmlNoNetExists(URL);
  if (iVar3 == 0) {
    if (bVar5) {
      URI = (xmlChar *)0x0;
    }
    else {
      URI = xmlCatalogLocalResolve(ctxt->catalogs,(xmlChar *)ID,(xmlChar *)URL);
    }
    if (!(bool)(URI != (xmlChar *)0x0 | bVar1 ^ 1)) {
      URI = xmlCatalogResolve((xmlChar *)ID,(xmlChar *)URL);
    }
    if ((URI != (xmlChar *)0x0) || (URI = xmlStrdup((xmlChar *)URL), URI != (xmlChar *)0x0)) {
      iVar3 = xmlNoNetExists((char *)URI);
      if (iVar3 != 0) {
        return URI;
      }
      if (bVar5) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        pxVar4 = xmlCatalogLocalResolveURI(ctxt->catalogs,URI);
      }
      if (!(bool)(bVar1 ^ 1) && pxVar4 == (xmlChar *)0x0) {
        pxVar4 = xmlCatalogResolveURI(URI);
      }
      if (pxVar4 != (xmlChar *)0x0) {
        (*xmlFree)(URI);
        return pxVar4;
      }
      return URI;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlResolveResourceFromCatalog(const char *URL, const char *ID,
                              xmlParserCtxtPtr ctxt) {
    xmlChar *resource = NULL;
    xmlCatalogAllow pref;
    int allowLocal = 0;
    int allowGlobal = 0;

    /*
     * Loading of HTML documents shouldn't use XML catalogs.
     */
    if ((ctxt != NULL) && (ctxt->html))
        return(NULL);

    /*
     * If the resource doesn't exists as a file,
     * try to load it from the resource pointed in the catalogs
     */
    pref = xmlCatalogGetDefaults();

    if ((ctxt != NULL) && (ctxt->catalogs != NULL) &&
        ((pref == XML_CATA_ALLOW_ALL) ||
         (pref == XML_CATA_ALLOW_DOCUMENT)))
        allowLocal = 1;

    if (((ctxt == NULL) ||
         ((ctxt->options & XML_PARSE_NO_SYS_CATALOG) == 0)) &&
        ((pref == XML_CATA_ALLOW_ALL) ||
         (pref == XML_CATA_ALLOW_GLOBAL)))
        allowGlobal = 1;

    if ((pref != XML_CATA_ALLOW_NONE) && (!xmlNoNetExists(URL))) {
	/*
	 * Do a local lookup
	 */
        if (allowLocal) {
	    resource = xmlCatalogLocalResolve(ctxt->catalogs,
					      (const xmlChar *)ID,
					      (const xmlChar *)URL);
        }
	/*
	 * Try a global lookup
	 */
	if ((resource == NULL) && (allowGlobal)) {
	    resource = xmlCatalogResolve((const xmlChar *)ID,
					 (const xmlChar *)URL);
	}
	if ((resource == NULL) && (URL != NULL))
	    resource = xmlStrdup((const xmlChar *) URL);

	/*
	 * TODO: do an URI lookup on the reference
	 */
	if ((resource != NULL) && (!xmlNoNetExists((const char *)resource))) {
	    xmlChar *tmp = NULL;

	    if (allowLocal) {
		tmp = xmlCatalogLocalResolveURI(ctxt->catalogs, resource);
	    }
	    if ((tmp == NULL) && (allowGlobal)) {
		tmp = xmlCatalogResolveURI(resource);
	    }

	    if (tmp != NULL) {
		xmlFree(resource);
		resource = tmp;
	    }
	}
    }

    return resource;
}